

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void executeTransaction(string *transbuffer,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *lockitem)

{
  pointer ppcVar1;
  column *pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  fd_set *pfVar6;
  fd_set *__writefds;
  table *ptVar7;
  UpdateStatement *stmt_00;
  reference pbVar8;
  long lVar9;
  reference pvVar10;
  size_t sVar11;
  SQLStatement *pSVar12;
  ostream *poVar13;
  char *pcVar14;
  fd_set *in_R8;
  timeval *in_R9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8;
  uint local_5ac;
  SQLParserResult *pSStack_5a8;
  uint i_4;
  SQLParserResult *result_3;
  SQLParserResult *pSStack_598;
  uint i_3;
  SQLParserResult *result_2;
  string local_570 [8];
  string t_query_1;
  string local_550 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_530;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int countupdate;
  int numberOfRowsModified;
  UpdateStatement *stmt_3;
  __cxx11 local_500 [4];
  uint i_2;
  string local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400 [8];
  string temp_update_query;
  undefined1 local_3e0 [79];
  allocator local_391;
  string local_390 [32];
  table *local_370;
  table *totable_2;
  SelectStatement *stmt_2;
  SQLParserResult *pSStack_358;
  uint i_1;
  SQLParserResult *result_1;
  string local_348 [4];
  int selectvalue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [8];
  string select_query;
  allocator local_281;
  string local_280 [8];
  string operation;
  string local_260 [8];
  string where;
  string local_240 [8];
  string stable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  string local_208 [8];
  string select_item;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_1e8;
  allocator local_1b1;
  string local_1b0 [32];
  table *local_190;
  table *totable_1;
  UpdateStatement *stmt_1;
  allocator local_149;
  string local_148 [32];
  table *local_128;
  table *totable;
  InsertStatement *stmt;
  SQLParserResult *pSStack_110;
  uint i;
  SQLParserResult *result;
  string local_100 [32];
  string local_e0 [8];
  string t_query;
  string local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  update_query;
  undefined1 local_68 [7];
  bool cancommit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  querys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  int local_20;
  int local_1c;
  int sleep_count;
  int sleep_time;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lockitem_local;
  string *transbuffer_local;
  
  local_1c = 1000;
  local_20 = 0;
  _sleep_count = lockitem;
  lockitem_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)transbuffer;
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,lockitem);
    bVar3 = check_true_size(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    if (bVar3) break;
    local_20 = local_20 + 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)
               &querys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               &querys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_20 < 4) {
      local_1c = local_1c << 1;
    }
    else {
      local_1c = 1000;
    }
  }
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_68,transbuffer,';');
  update_query.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
  local_a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
  while (bVar3 = __gnu_cxx::operator!=(&__end1,&local_a0), bVar3) {
    pbVar8 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_c0,(string *)pbVar8);
    std::__cxx11::string::string(local_100,local_c0);
    removespace(local_e0);
    std::__cxx11::string::~string(local_100);
    lVar9 = std::__cxx11::string::length();
    if (lVar9 == 0) {
      result._4_4_ = 5;
    }
    else {
      lVar9 = std::__cxx11::string::find((char *)local_c0,0x1447a3);
      if ((lVar9 == -1) &&
         (lVar9 = std::__cxx11::string::find((char *)local_c0,0x14490b), lVar9 == -1)) {
        std::__cxx11::string::operator+=(local_c0,";");
        pSStack_110 = hsql::SQLParser::parseSQLString((string *)local_c0);
        bVar3 = hsql::SQLParserResult::isValid(pSStack_110);
        if (bVar3) {
          for (stmt._4_4_ = 0; uVar5 = (ulong)stmt._4_4_,
              sVar11 = hsql::SQLParserResult::size(pSStack_110), uVar5 < sVar11;
              stmt._4_4_ = stmt._4_4_ + 1) {
            lVar9 = std::__cxx11::string::find((char *)local_c0,0x14208b);
            if (lVar9 != -1) {
              totable = (table *)hsql::SQLParserResult::getMutableStatement(pSStack_110,stmt._4_4_);
              ppcVar1 = (totable->table_cols).
                        super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_148,(char *)ppcVar1,&local_149);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                     *)&stmt_1,&table_list_abi_cxx11_);
              ptVar7 = util::getTable((string *)local_148,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                       *)&stmt_1);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                      *)&stmt_1);
              std::__cxx11::string::~string(local_148);
              std::allocator<char>::~allocator((allocator<char> *)&local_149);
              local_128 = ptVar7;
              if (ptVar7 == (table *)0x0) {
                update_query.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
              }
              else {
                bVar3 = table::insertcheck(ptVar7,(InsertStatement *)totable);
                if (!bVar3) {
                  update_query.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                }
              }
            }
            lVar9 = std::__cxx11::string::find((char *)local_c0,0x1450f5);
            if (lVar9 != -1) {
              totable_1 = (table *)hsql::SQLParserResult::getMutableStatement
                                             (pSStack_110,stmt._4_4_);
              pcVar2 = (totable_1->table_cols).
                       super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[3];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1b0,(char *)pcVar2,&local_1b1);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::map(&local_1e8,&table_list_abi_cxx11_);
              ptVar7 = util::getTable((string *)local_1b0,&local_1e8);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
              ::~map(&local_1e8);
              std::__cxx11::string::~string(local_1b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
              local_190 = ptVar7;
              if (ptVar7 == (table *)0x0) {
                poVar13 = std::operator<<((ostream *)&std::cout,"cannot update this statement");
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                update_query.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
              }
              if ((local_190 != (table *)0x0) &&
                 (bVar3 = table::updatecheck(local_190,(UpdateStatement *)totable_1), !bVar3)) {
                poVar13 = std::operator<<((ostream *)&std::cout,"cannot update this statement");
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                update_query.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
              }
            }
          }
        }
        else {
          lVar9 = std::__cxx11::string::find((char *)local_c0,0x1450f5);
          if (lVar9 == -1) {
            update_query.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          }
          else {
            lVar9 = std::__cxx11::string::find((char *)local_c0,0x14492f);
            if (lVar9 != -1) {
              update_query.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            }
            std::__cxx11::string::find((char *)local_c0,0x14493b);
            std::__cxx11::string::find((char *)local_c0,0x141e46);
            std::__cxx11::string::find((char *)local_c0,0x14493b);
            std::__cxx11::string::substr((ulong)local_208,(ulong)local_c0);
            split(&local_220,local_208,'=');
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_220,0);
            std::__cxx11::string::operator=((string *)local_208,(string *)pvVar10);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_220);
            std::__cxx11::string::find((char *)local_c0,0x1450f5);
            std::__cxx11::string::find((char *)local_c0,0x14493b);
            std::__cxx11::string::find((char *)local_c0,0x1450f5);
            std::__cxx11::string::substr((ulong)local_240,(ulong)local_c0);
            std::__cxx11::string::find((char *)local_c0,0x141e46);
            std::__cxx11::string::find((char *)local_c0,0x1447e5);
            std::__cxx11::string::find((char *)local_c0,0x141e46);
            std::__cxx11::string::substr((ulong)local_260,(ulong)local_c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_280,"",&local_281);
            std::allocator<char>::~allocator((allocator<char> *)&local_281);
            lVar9 = std::__cxx11::string::find((char *)local_c0,0x14493f);
            if (lVar9 == -1) {
              std::__cxx11::string::operator=(local_280,"+");
            }
            else {
              std::__cxx11::string::operator=(local_280,"-");
            }
            std::operator+((char *)local_348,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "select ");
            std::operator+(local_328,(char *)local_348);
            std::operator+(local_308,local_328);
            std::operator+(local_2e8,(char *)local_308);
            std::operator+(local_2c8,local_2e8);
            std::operator+(local_2a8,(char *)local_2c8);
            std::__cxx11::string::~string((string *)local_2c8);
            std::__cxx11::string::~string((string *)local_2e8);
            std::__cxx11::string::~string((string *)local_308);
            std::__cxx11::string::~string((string *)local_328);
            std::__cxx11::string::~string(local_348);
            result_1._4_4_ = -1;
            pSStack_358 = hsql::SQLParser::parseSQLString(local_2a8);
            bVar3 = hsql::SQLParserResult::isValid(pSStack_358);
            if (bVar3) {
              for (stmt_2._4_4_ = 0; pfVar6 = (fd_set *)(ulong)stmt_2._4_4_,
                  __writefds = (fd_set *)hsql::SQLParserResult::size(pSStack_358),
                  pfVar6 < __writefds; stmt_2._4_4_ = stmt_2._4_4_ + 1) {
                totable_2 = (table *)hsql::SQLParserResult::getMutableStatement
                                               (pSStack_358,stmt_2._4_4_);
                if (*(int *)((totable_2->table_cols).
                             super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1) == 0) {
                  pcVar2 = (totable_2->table_cols).
                           super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                           super__Vector_impl_data._M_finish[3];
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_390,(char *)pcVar2,&local_391);
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                         *)(local_3e0 + 0x18),&table_list_abi_cxx11_);
                  ptVar7 = util::getTable((string *)local_390,
                                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                           *)(local_3e0 + 0x18));
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                          *)(local_3e0 + 0x18));
                  std::__cxx11::string::~string(local_390);
                  std::allocator<char>::~allocator((allocator<char> *)&local_391);
                  local_370 = ptVar7;
                  if (ptVar7 == (table *)0x0) {
                    poVar13 = std::operator<<((ostream *)&std::cout,"did not find table ");
                    poVar13 = std::operator<<(poVar13,(char *)(totable_2->table_cols).
                                                                                                                            
                                                  super__Vector_base<column_*,_std::allocator<column_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[3]);
                    poVar13 = std::operator<<(poVar13," from database");
                    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                    update_query.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                  }
                  ptVar7 = totable_2;
                  if (local_370 != (table *)0x0) {
                    table::select_abi_cxx11_
                              ((table *)local_3e0,(int)local_370,(fd_set *)totable_2,__writefds,
                               in_R8,in_R9);
                    util::PrintRecords((SelectStatement *)ptVar7,
                                       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                                        *)local_3e0,local_370,(int *)((long)&result_1 + 4));
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                               *)local_3e0);
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_280,"-");
                    if (bVar3) {
                      result_1._4_4_ = result_1._4_4_ + -1;
                    }
                    else {
                      result_1._4_4_ = result_1._4_4_ + 1;
                    }
                    if (result_1._4_4_ < 0) {
                      update_query.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                    }
                  }
                }
              }
            }
            else {
              update_query.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            }
            std::operator+((char *)local_4e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "update ");
            std::operator+(local_4c0,(char *)local_4e0);
            std::operator+(local_4a0,local_4c0);
            std::operator+(local_480,(char *)local_4a0);
            std::__cxx11::to_string(local_500,result_1._4_4_);
            std::operator+(local_460,local_480);
            std::operator+(local_440,(char *)local_460);
            std::operator+(local_420,local_440);
            std::operator+(local_400,(char *)local_420);
            std::__cxx11::string::~string((string *)local_420);
            std::__cxx11::string::~string((string *)local_440);
            std::__cxx11::string::~string((string *)local_460);
            std::__cxx11::string::~string((string *)local_500);
            std::__cxx11::string::~string((string *)local_480);
            std::__cxx11::string::~string((string *)local_4a0);
            std::__cxx11::string::~string((string *)local_4c0);
            std::__cxx11::string::~string(local_4e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1,local_400);
            pSStack_358 = hsql::SQLParser::parseSQLString(local_400);
            bVar3 = hsql::SQLParserResult::isValid(pSStack_358);
            if (bVar3) {
              for (stmt_3._4_4_ = 0; sVar11 = hsql::SQLParserResult::size(pSStack_358),
                  stmt_3._4_4_ < sVar11; stmt_3._4_4_ = stmt_3._4_4_ + 1) {
                stmt_00 = (UpdateStatement *)
                          hsql::SQLParserResult::getMutableStatement(pSStack_358,stmt_3._4_4_);
                bVar3 = executeUpdate(stmt_00,&table_list_abi_cxx11_,true);
                if (!bVar3) {
                  update_query.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                }
              }
            }
            else {
              update_query.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            }
            std::__cxx11::string::~string((string *)local_400);
            std::__cxx11::string::~string((string *)local_2a8);
            std::__cxx11::string::~string(local_280);
            std::__cxx11::string::~string(local_260);
            std::__cxx11::string::~string(local_240);
            std::__cxx11::string::~string((string *)local_208);
          }
        }
        if ((update_query.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          result._4_4_ = 4;
        }
        else {
          result._4_4_ = 0;
        }
      }
      else {
        result._4_4_ = 5;
      }
    }
    std::__cxx11::string::~string((string *)local_e0);
    if (result._4_4_ == 0) {
      result._4_4_ = 0;
    }
    std::__cxx11::string::~string(local_c0);
    if ((result._4_4_ != 0) && (result._4_4_ == 4)) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  __range2._4_4_ = 0;
  if ((update_query.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    __range2._0_4_ = 0;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
    local_530._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68);
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&local_530), bVar3) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_550,(string *)pbVar8);
      std::__cxx11::string::string((string *)&result_2,local_550);
      removespace(local_570);
      std::__cxx11::string::~string((string *)&result_2);
      lVar9 = std::__cxx11::string::length();
      if (lVar9 == 0) {
        result._4_4_ = 0x10;
      }
      else {
        lVar9 = std::__cxx11::string::find((char *)local_550,0x1447a3);
        if ((lVar9 == -1) &&
           (lVar9 = std::__cxx11::string::find((char *)local_550,0x14490b), lVar9 == -1)) {
          std::__cxx11::string::operator+=(local_550,";");
          pSStack_598 = hsql::SQLParser::parseSQLString((string *)local_550);
          bVar3 = hsql::SQLParserResult::isValid(pSStack_598);
          if (bVar3) {
            for (result_3._4_4_ = 0; uVar5 = (ulong)result_3._4_4_,
                sVar11 = hsql::SQLParserResult::size(pSStack_598), uVar5 < sVar11;
                result_3._4_4_ = result_3._4_4_ + 1) {
              pSVar12 = hsql::SQLParserResult::getMutableStatement(pSStack_598,result_3._4_4_);
              executeStatement(pSVar12,&table_list_abi_cxx11_);
              saveToFile(&table_list_abi_cxx11_);
            }
          }
          else {
            lVar9 = std::__cxx11::string::find((char *)local_550,0x1450f5);
            if (lVar9 != -1) {
              __range2._4_4_ = __range2._4_4_ + 1;
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&__range1,(long)(int)__range2);
              std::__cxx11::string::operator=(local_550,(string *)pvVar10);
              __range2._0_4_ = (int)__range2 + 1;
            }
            pSStack_5a8 = hsql::SQLParser::parseSQLString((string *)local_550);
            bVar3 = hsql::SQLParserResult::isValid(pSStack_5a8);
            if (bVar3) {
              for (local_5ac = 0; uVar5 = (ulong)local_5ac,
                  sVar11 = hsql::SQLParserResult::size(pSStack_5a8), uVar5 < sVar11;
                  local_5ac = local_5ac + 1) {
                pSVar12 = hsql::SQLParserResult::getMutableStatement(pSStack_5a8,local_5ac);
                executeStatement(pSVar12,&table_list_abi_cxx11_);
                saveToFile(&table_list_abi_cxx11_);
              }
            }
            else {
              poVar13 = std::operator<<((ostream *)&std::cout,
                                        "Given string is not a valid SQL query.");
              poVar13 = (ostream *)
                        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
              pcVar14 = hsql::SQLParserResult::errorMsg(pSStack_5a8);
              poVar13 = std::operator<<(poVar13,pcVar14);
              poVar13 = std::operator<<(poVar13,"(");
              iVar4 = hsql::SQLParserResult::errorLine(pSStack_5a8);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar4);
              poVar13 = std::operator<<(poVar13,":");
              iVar4 = hsql::SQLParserResult::errorColumn(pSStack_5a8);
              poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar4);
              poVar13 = std::operator<<(poVar13,")");
              std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            }
          }
          result._4_4_ = 0;
        }
        else {
          result._4_4_ = 0x10;
        }
      }
      std::__cxx11::string::~string((string *)local_570);
      if (result._4_4_ == 0) {
        result._4_4_ = 0;
      }
      std::__cxx11::string::~string(local_550);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5c8,lockitem);
  unlock_items(&local_5c8,__range2._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  return;
}

Assistant:

void executeTransaction(string transbuffer, vector<string> lockitem){
//    //check queue if thread in or out
    //lock on the record
//    con.lock();
//    for(auto item: lockitem) {
//        int sleep_time = 1000;
//        while (true) {
//            //con.lock();
//            //cout << item << "condition is : " << locks[item]<<endl;
//            if (locks.find(item) != locks.end() && locks[item] == 0) {
//                locks[item] = 1;
//                //con.unlock();
//                break;
//            }
//            if (locks.find(item) == locks.end()) {
//                locks.insert(make_pair(item, 1));
//                //con.unlock();
//                break;
//            }
//
//        }
//
//        this_thread::sleep_for(chrono::milliseconds(sleep_time));
//        sleep_time *= 2;
//    }
//
//    con.unlock();

    int sleep_time = 1000;
    int sleep_count = 0;
    while(true){
        if(check_true_size(lockitem)){
            break;
        }
        sleep_count++;
        //int v2 = rand() % 1000 + 1;
        this_thread::sleep_for(chrono::milliseconds(sleep_time));
        if(sleep_count > 3){
            sleep_time = 1000;
        }
        else{
            sleep_time *= 2;
        }
    }



    //threads_id.push(this_thread::get_id());

//    string previous_item = "";
//
//    //lock
//    con.lock();
//    while(true){
//
//        int true_size = 0;
//        map<string, int> temp_locks;
//
//        for(auto item: lockitem) {
//
//            if(item == previous_item){
//                previous_item = item;
//                true_size++;
//                continue;
//            }
//            else if(locks.find(item) != locks.end() && locks[item] == 0)
//            {
//                temp_locks[item] = 1;
//                locks[item] = 1;
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//
//            else if(locks.find(item) == locks.end()){
//
//                temp_locks[item] = 1;
//                locks.insert(make_pair(item, 1));
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//            previous_item = item;
//        }
//        if(true_size == lockitem.size()){
//            con.unlock();
//            break;
//        }
//        else {
//            for (std::map<string, int>::iterator it = temp_locks.begin(); it != temp_locks.end(); ++it) {
//                if (it->second == 1) {
//                    locks[it->first] = 0;
//                }
//            }
//        }
//        //int v2 = rand() % 1000 + 1;
//        this_thread::sleep_for(chrono::milliseconds(1000));
//    }

    //unlock
    //con.unlock();

    //check if the transbuffer can be executed.
    vector<string> querys = split(transbuffer, ';');
    bool cancommit = true;
    vector<string> update_query;

    for(auto query : querys){

        string t_query = removespace(query);
        if(t_query.length() < 1)
            continue;
        if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
            continue;

        query += ";";
        hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);
        // check whether the parsing was successful
        if (result->isValid()) {
            for (unsigned i = 0; i < result->size(); ++i) {
                //run sql query


                //check insert
                if(query.find("insert") != string::npos){

                    hsql::InsertStatement *stmt = (hsql::InsertStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->tableName, table_list);
                    if(totable == NULL)
                        cancommit = false;
                    if(totable != NULL && !totable->insertcheck(stmt))
                        cancommit = false;

                }

                if(query.find("update") != string::npos){
                    hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->table->name, table_list);
                    if(totable == NULL)
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }
                    if(totable != NULL && !totable->updatecheck(stmt))
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }

                }


            }
        } else {

            //split update to two querys and check again
            if(query.find("update") != string::npos ){
                if(query.find("insert into") != string::npos )
                    cancommit = false;;
                string select_item = query.substr(query.find("set") + 3, query.find("where") - query.find("set") - 3);
                select_item = split(select_item, '=')[0];
                string stable = query.substr(query.find("update") + 6, query.find("set") - query.find("update") -6);
                string where = query.substr(query.find("where") + 5, query.find(";") - query.find("where") - 5);
                string operation = "";
                if(query.find("-")!= string::npos)
                    operation="-";
                else
                    operation="+";


                string select_query = "select " + select_item + " from " + stable + " where " + where + ";";


                //select query
                int selectvalue = -1;
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(select_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::SelectStatement *stmt = (hsql::SelectStatement*)result->getMutableStatement(i);
                        if(stmt->fromTable->type == hsql::kTableName){
                            table* totable = util::getTable(stmt->fromTable->name, table_list);
                            if(totable == NULL){
                                cout<< "did not find table " << stmt->fromTable->name << " from database"<<endl;
                                cancommit = false;
                            }

                            if(totable != nullptr) {
                                util::PrintRecords(stmt, totable->select(stmt), totable, selectvalue);
                                if(operation == "-")
                                    selectvalue -= 1;
                                else
                                    selectvalue += 1;
                                if(selectvalue < 0)
                                    cancommit = false;

                            }
                        }

                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }
                //update query
                string temp_update_query = "update " + stable + " set " + select_item + " = " + to_string(selectvalue) + " where " + where + ";";
                update_query.push_back(temp_update_query);
                result = hsql::SQLParser::parseSQLString(temp_update_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                        if(!executeUpdate(stmt, table_list, true)){
                            cancommit = false;
                        }
                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }


            }
            else{
                //cout << "Given string is not a valid SQL query." << endl
                 //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                cancommit = false;
            }


        }

        //cout << "find query" << query << endl;
        if(cancommit == false)
            break;
    }


    //commit
    int numberOfRowsModified = 0;
    if(cancommit){
        //cout << "do commit" << endl;
        int countupdate = 0;
        for(auto query: querys){
            //cout << "query: " << query << endl;
            string t_query = removespace(query);
            if(t_query.length() < 1)
                continue;
            if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
                continue;

            query += ";";
            hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

            // check whether the parsing was successful
            if (result->isValid()) {
                for (unsigned i = 0; i < result->size(); ++i) {
                    //run sql query
                    executeStatement(result->getMutableStatement(i), table_list);
                    saveToFile(table_list);

                }
            } else {
                if(query.find("update") != string::npos){
                    numberOfRowsModified++;
                    query = update_query[countupdate];
                    countupdate += 1;
                }
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

                // check whether the parsing was successful
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        executeStatement(result->getMutableStatement(i), table_list);
                        saveToFile(table_list);
                    }
                }
                else{
                    cout << "Given string is not a valid SQL query." << endl
                         << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                }

            }

        }
    }

    //execute the transbuffr
    unlock_items(lockitem, numberOfRowsModified);



}